

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
GameInfoIRCCommand::trigger
          (GameInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  undefined4 uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  bool bVar12;
  ulong uVar13;
  bool bVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  IRC_Bot *local_98;
  size_t local_90;
  char *local_88;
  undefined4 local_7c;
  long local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  long local_60 [2];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)nick._M_str;
  pcVar10 = channel._M_str;
  sVar11 = channel._M_len;
  local_98 = source;
  lVar4 = Jupiter::IRC::Client::getChannel(source,sVar11,pcVar10,pcVar10,nick._M_len);
  if (lVar4 != 0) {
    uVar2 = Jupiter::IRC::Client::Channel::getType();
    RenX::getCore();
    lVar4 = RenX::Core::getServerCount();
    if (lVar4 != 0) {
      bVar12 = false;
      uVar13 = 1;
      local_90 = sVar11;
      local_88 = pcVar10;
      local_7c = uVar2;
      do {
        uVar5 = RenX::getCore();
        lVar4 = RenX::Core::getServer(uVar5);
        cVar1 = RenX::Server::isLogChanType((int)lVar4);
        if (cVar1 != '\0') {
          lVar6 = RenX::Server::getMap();
          lVar7 = RenX::Server::getGameTime();
          uVar8 = RenX::Server::getGameVersion();
          RenX::Server::getGameVersion();
          string_printf_abi_cxx11_(&local_b8,"\x0303[GameInfo] \x03%.*s",uVar8,extraout_RDX);
          Jupiter::IRC::Client::sendMessage
                    (local_98,local_90,local_88,local_b8._M_string_length,local_b8._M_dataplus._M_p)
          ;
          local_78 = lVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          local_40._0_8_ = 0x17;
          local_40._8_8_ = "\x0303[GameInfo] \x0310Map\x03: ";
          local_50._0_8_ = (pointer)0xc;
          local_50._8_8_ = "; \x0310GUID\x03: ";
          RenX::formatGUID_abi_cxx11_((Map *)&local_70);
          jessilib::
          join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                    (&local_b8,(jessilib *)local_40,
                     (basic_string_view<char,_std::char_traits<char>_> *)(lVar6 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_70,args_3);
          pcVar10 = local_88;
          sVar11 = local_90;
          Jupiter::IRC::Client::sendMessage
                    (local_98,local_90,local_88,local_b8._M_string_length,local_b8._M_dataplus._M_p)
          ;
          lVar4 = local_78;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((long *)local_70._M_len != local_60) {
            operator_delete((void *)local_70._M_len,local_60[0] + 1);
          }
          lVar6 = lVar7 / 1000;
          iVar9 = (int)lVar6 +
                  ((int)(SUB168(SEXT816(lVar6) * SEXT816(0x48d159e26af37c05),8) >> 10) -
                  (SUB164(SEXT816(lVar6) * SEXT816(0x48d159e26af37c05),0xc) >> 0x1f)) * -0xe10;
          uVar3 = ((uint)((short)iVar9 * -0x7777) >> 0x10) + iVar9;
          string_printf_abi_cxx11_
                    (&local_b8,"\x0303[GameInfo] \x0310Elapsed time\x03: %.2lld:%.2lld:%.2lld",
                     lVar7 / 3600000,
                     (long)(short)(((short)uVar3 >> 5) + (short)((uVar3 & 0xffff) >> 0xf)),
                     lVar6 % 0x3c);
          Jupiter::IRC::Client::sendMessage
                    (local_98,sVar11,pcVar10,local_b8._M_string_length,local_b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          string_printf_abi_cxx11_
                    (&local_b8,"\x0303[GameInfo] \x03There are \x0310%d\x03 players online.",
                     *(undefined8 *)(lVar4 + 0x20));
          Jupiter::IRC::Client::sendMessage
                    (local_98,sVar11,pcVar10,local_b8._M_string_length,local_b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          bVar12 = true;
        }
        RenX::getCore();
        uVar5 = RenX::Core::getServerCount();
        bVar14 = uVar5 != uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (bVar14);
      pcVar10 = local_88;
      sVar11 = local_90;
      if (bVar12) {
        return;
      }
    }
    Jupiter::IRC::Client::sendMessage
              (local_98,sVar11,pcVar10,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
  }
  return;
}

Assistant:

void GameInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		bool match = false;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				match = true;
				const RenX::Map &map = server->getMap();
				std::chrono::seconds time = std::chrono::duration_cast<std::chrono::seconds>(server->getGameTime());
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "%.*s", server->getGameVersion().size(), server->getGameVersion().data()));
				source->sendMessage(channel, jessilib::join<std::string>(IRCCOLOR "03[GameInfo] " IRCCOLOR "10Map" IRCCOLOR ": "sv, map.name, "; " IRCCOLOR "10GUID" IRCCOLOR ": "sv, RenX::formatGUID(map)));
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "10Elapsed time" IRCCOLOR ": %.2lld:%.2lld:%.2lld", time.count() / 3600, (time.count() % 3600) / 60, time.count() % 60));
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "There are " IRCCOLOR "10%d" IRCCOLOR " players online.", server->players.size()));
			}
		}
		if (match == false)
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}